

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

int AF_AActor_Teleport(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *thing;
  DAngle local_48;
  DVector3 local_40;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00456e4e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    thing = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (thing != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00456e4e;
        }
        goto LAB_00456d6b;
      }
    }
    else if (thing != (AActor *)0x0) goto LAB_00456e3e;
    thing = (AActor *)0x0;
LAB_00456d6b:
    if (numparam == 1) {
      pcVar3 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if ((uint)numparam < 3) {
          pcVar3 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar3 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                if ((uint)numparam < 5) {
                  pcVar3 = "(paramnum) < numparam";
                }
                else {
                  if (param[4].field_0.field_3.Type == '\x01') {
                    if (numparam == 5) {
                      pcVar3 = "(paramnum) < numparam";
                    }
                    else {
                      if (param[5].field_0.field_3.Type == '\0') {
                        local_40.X = (double)param[1].field_0.field_1.a;
                        local_40.Y = (double)param[2].field_0.field_1.a;
                        local_40.Z = (double)param[3].field_0.field_1.a;
                        local_48.Degrees = (double)param[4].field_0.field_1.a;
                        bVar1 = P_Teleport(thing,&local_40,&local_48,param[5].field_0.i);
                        if (numret < 1) {
                          iVar2 = 0;
                        }
                        else {
                          if (ret == (VMReturn *)0x0) {
                            __assert_fail("ret != NULL",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                          ,0xf9,
                                          "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                         );
                          }
                          VMReturn::SetInt(ret,(uint)bVar1);
                          iVar2 = 1;
                        }
                        return iVar2;
                      }
                      pcVar3 = "param[paramnum].Type == REGT_INT";
                    }
                    __assert_fail(pcVar3,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                  ,0xf8,
                                  "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  pcVar3 = "param[paramnum].Type == REGT_FLOAT";
                }
                __assert_fail(pcVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                              ,0xf7,
                              "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              pcVar3 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                          ,0xf6,
                          "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar3 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                      ,0xf5,
                      "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar3 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0xf4,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00456e3e:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00456e4e:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                ,0xf3,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Teleport)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_ANGLE(an);
	PARAM_INT(flags);
	ACTION_RETURN_BOOL(P_Teleport(self, DVector3(x, y, z), an, flags));
}